

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_symbol.hpp
# Opt level: O3

numeric_type __thiscall
viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>_>::unwrap
          (rt_function_symbol<viennamath::rt_expression_interface<double>_> *this)

{
  expression_not_unwrappable_exception *this_00;
  string local_40;
  
  this_00 = (expression_not_unwrappable_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot evaluate rt_function_symbol to a number!","");
  expression_not_unwrappable_exception::expression_not_unwrappable_exception(this_00,&local_40);
  __cxa_throw(this_00,&expression_not_unwrappable_exception::typeinfo,
              expression_not_unwrappable_exception::~expression_not_unwrappable_exception);
}

Assistant:

numeric_type unwrap() const { throw expression_not_unwrappable_exception("Cannot evaluate rt_function_symbol to a number!"); }